

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.h
# Opt level: O3

void __thiscall tt::net::Channel::handleEvents(Channel *this)

{
  uint uVar1;
  
  this->m_events = 0;
  uVar1 = this->m_revents;
  if ((uVar1 & 0x11) != 0x10) {
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x2003) != 0) {
        handleRead(this);
        uVar1 = this->m_revents;
      }
      if ((uVar1 & 4) != 0) {
        handleWrite(this);
      }
      handleConn(this);
      return;
    }
    if ((this->m_errorHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_errorHandler)._M_invoker)((_Any_data *)&this->m_errorHandler);
    }
    this->m_events = 0;
  }
  return;
}

Assistant:

void handleEvents(){
		
		m_events = 0;
		
		if((m_revents & EPOLLHUP) && !(m_revents & EPOLLIN)){
			m_events = 0;

			return ;
		}

		if(m_revents & EPOLLERR){
			if(m_errorHandler) m_errorHandler();

			m_events = 0;

			return ;
		}

		if(m_revents & (EPOLLIN | EPOLLPRI | EPOLLRDHUP)){
			handleRead();
		}

		if(m_revents & EPOLLOUT){
			handleWrite();
		}

		handleConn();
	}